

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O0

void __thiscall Analyser::addVariable(Analyser *this,string *var,bool isConstant)

{
  bool bVar1;
  Error *pEVar2;
  mapped_type *pmVar3;
  allocator<char> local_a1;
  string local_a0;
  _Self local_80;
  _Self local_78;
  undefined1 local_6d;
  allocator<char> local_59;
  string local_58;
  _Self local_38;
  _Self local_30;
  pair<bool,_int> local_24;
  pair<bool,_int> valStruct;
  bool isConstant_local;
  string *var_local;
  Analyser *this_local;
  
  valStruct._3_1_ = isConstant;
  unique0x10000294 = var;
  std::pair<bool,_int>::pair<bool_&,_int_&,_true>
            (&local_24,(bool *)&valStruct.field_0x3,&this->_localIndex);
  if (this->_currentFunction == -1) {
    local_30._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_int>_>_>_>
         ::find(&this->_globalVars,stack0xffffffffffffffe8);
    local_38._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_int>_>_>_>
         ::end(&this->_globalVars);
    bVar1 = std::operator!=(&local_30,&local_38);
    if (bVar1) {
      local_6d = 1;
      pEVar2 = (Error *)__cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"this identifier has been declared",&local_59);
      Error::Error(pEVar2,&local_58,(long)this->_currentLine);
      local_6d = 0;
      __cxa_throw(pEVar2,&Error::typeinfo,Error::~Error);
    }
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_int>_>_>_>
             ::operator[](&this->_globalVars,stack0xffffffffffffffe8);
    std::pair<bool,_int>::operator=(pmVar3,&local_24);
  }
  else {
    local_78._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_int>_>_>_>
         ::find(&this->_localVars,stack0xffffffffffffffe8);
    local_80._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_int>_>_>_>
         ::end(&this->_localVars);
    bVar1 = std::operator!=(&local_78,&local_80);
    if (bVar1) {
      pEVar2 = (Error *)__cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,"this identifier has been declared",&local_a1);
      Error::Error(pEVar2,&local_a0,(long)this->_currentLine);
      __cxa_throw(pEVar2,&Error::typeinfo,Error::~Error);
    }
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_int>_>_>_>
             ::operator[](&this->_localVars,stack0xffffffffffffffe8);
    std::pair<bool,_int>::operator=(pmVar3,&local_24);
  }
  this->_localIndex = this->_localIndex + 1;
  return;
}

Assistant:

void Analyser::addVariable(const std::string& var, bool isConstant) {
	std::pair<bool, std::int32_t> valStruct(isConstant, _localIndex);
	if (_currentFunction == -1) {
		if (_globalVars.find(var) != _globalVars.end()) {
			throw Error("this identifier has been declared", _currentLine);
		}
		else {
			_globalVars[var] = valStruct;
		}
	}
	else {
		if (_localVars.find(var) != _localVars.end()) {
			throw Error("this identifier has been declared", _currentLine);
		}
		else {
			_localVars[var] = valStruct;
		}
	}
	_localIndex++;
}